

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SiameseEncoder.cpp
# Opt level: O1

SiameseResult __thiscall
siamese::Encoder::GenerateSinglePacket(Encoder *this,SiameseRecoveryPacket *packet)

{
  GrowingAlignedDataBuffer *this_00;
  ostringstream *this_01;
  uint uVar1;
  uint uVar2;
  undefined1 auVar3 [16];
  byte bVar4;
  bool bVar5;
  SiameseResult SVar6;
  uint8_t *puVar7;
  OutputWorker *this_02;
  long lVar8;
  undefined1 local_1b0 [392];
  
  uVar1 = (this->Window).FirstUnremovedElement;
  this_00 = &((this->Window).Subwindows.DataPtr[uVar1 >> 6]->Originals)._M_elems[uVar1 & 0x3f].
             Buffer;
  uVar1 = this_00->Bytes;
  bVar5 = GrowingAlignedDataBuffer::GrowZeroPadded(this_00,&this->TheAllocator,uVar1 + 8);
  if (bVar5) {
    this_00->Bytes = uVar1;
    uVar2 = *(uint *)&this_00[1].Data;
    puVar7 = this_00->Data + uVar1;
    if (uVar2 < 0x80) {
      *puVar7 = (uint8_t)uVar2;
      lVar8 = 1;
    }
    else {
      bVar4 = (byte)(uVar2 >> 8);
      *puVar7 = (uint8_t)uVar2;
      if (uVar2 < 0x4000) {
        puVar7[1] = bVar4 | 0x80;
        lVar8 = 2;
      }
      else {
        puVar7[1] = bVar4;
        puVar7[2] = (byte)(uVar2 >> 0x10) | 0xc0;
        lVar8 = 3;
      }
    }
    puVar7[lVar8] = '\0';
    packet->Data = this_00->Data;
    packet->DataBytes = uVar1 + 1 + (int)lVar8;
    if (DAT_001be078 < 3) {
      this_01 = (ostringstream *)(local_1b0 + 0x10);
      local_1b0._0_8_ = Logger;
      local_1b0._8_4_ = Info;
      std::__cxx11::ostringstream::ostringstream(this_01);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_01,DAT_001be0a8,DAT_001be0b0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_01,"Generated single recovery packet start=",0x27);
      std::ostream::_M_insert<unsigned_long>((ulong)this_01);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01," ldpcCount=",0xb);
      std::ostream::_M_insert<unsigned_long>((ulong)this_01);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01," sumCount=",10);
      std::ostream::_M_insert<unsigned_long>((ulong)this_01);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01," row=",5);
      std::ostream::_M_insert<unsigned_long>((ulong)this_01);
      this_02 = logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(this_02,(LogStringBuffer *)local_1b0);
      std::__cxx11::ostringstream::~ostringstream(this_01);
      std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x80));
    }
    auVar3 = vpmovsxbq_avx(ZEXT216(0x101));
    auVar3 = vpinsrq_avx(auVar3,(ulong)packet->DataBytes,1);
    auVar3 = vpaddq_avx(auVar3,*(undefined1 (*) [16])((this->Stats).Counts + 2));
    *(undefined1 (*) [16])((this->Stats).Counts + 2) = auVar3;
    SVar6 = Siamese_Success;
  }
  else {
    (this->Window).EmergencyDisabled = true;
    SVar6 = Siamese_Disabled;
  }
  return SVar6;
}

Assistant:

SiameseResult Encoder::GenerateSinglePacket(SiameseRecoveryPacket& packet)
{
    OriginalPacket* original     = Window.GetWindowElement(Window.FirstUnremovedElement);
    const unsigned originalBytes = original->Buffer.Bytes;

    // Note: This often does not actually reallocate or move since we overallocate
    if (!original->Buffer.GrowZeroPadded(&TheAllocator, originalBytes + kMaxRecoveryMetadataBytes))
    {
        Window.EmergencyDisabled = true;
        return Siamese_Disabled;
    }

    // Set bytes back to original
    original->Buffer.Bytes = originalBytes;

    // Serialize metadata into the last few bytes of the packet
    // Note: This saves an extra copy to move the data around
    RecoveryMetadata metadata;
    metadata.SumCount    = 1;
    metadata.LDPCCount   = 1;
    metadata.ColumnStart = original->Column;
    metadata.Row         = 0;

    const unsigned footerBytes = SerializeFooter_RecoveryMetadata(metadata, original->Buffer.Data + originalBytes);
    packet.Data      = original->Buffer.Data;
    packet.DataBytes = originalBytes + footerBytes;

    Logger.Info("Generated single recovery packet start=", metadata.ColumnStart, " ldpcCount=", metadata.LDPCCount, " sumCount=", metadata.SumCount, " row=", metadata.Row);

    Stats.Counts[SiameseEncoderStats_RecoveryCount]++;
    Stats.Counts[SiameseEncoderStats_RecoveryBytes] += packet.DataBytes;

    return Siamese_Success;
}